

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unicode.hpp
# Opt level: O1

bool cppjieba::DecodeRunesInString(char *s,size_t len,Unicode *unicode)

{
  bool bVar1;
  ulong uVar2;
  long lVar3;
  RuneStrArray runes;
  RuneStrArray RStack_188;
  
  if ((Unicode *)unicode->ptr_ != unicode) {
    free((Unicode *)unicode->ptr_);
  }
  unicode->ptr_ = unicode->buffer_;
  unicode->size_ = 0;
  unicode->capacity_ = 0x10;
  memset(&RStack_188,0,0x140);
  RStack_188.size_ = 0;
  RStack_188.capacity_ = 0x10;
  RStack_188.ptr_ = RStack_188.buffer_;
  bVar1 = DecodeRunesInString(s,len,&RStack_188);
  if (bVar1) {
    limonp::LocalVector<unsigned_int>::reserve(unicode,RStack_188.size_);
    if (RStack_188.size_ != 0) {
      lVar3 = 0;
      uVar2 = 0;
      do {
        limonp::LocalVector<unsigned_int>::push_back
                  (unicode,(uint *)((long)&(RStack_188.ptr_)->rune + lVar3));
        uVar2 = uVar2 + 1;
        lVar3 = lVar3 + 0x14;
      } while (uVar2 < RStack_188.size_);
    }
  }
  if ((RuneStrArray *)RStack_188.ptr_ != &RStack_188) {
    free(RStack_188.ptr_);
  }
  return bVar1;
}

Assistant:

inline bool DecodeRunesInString(const char* s, size_t len, Unicode& unicode) {
  unicode.clear();
  RuneStrArray runes;
  if (!DecodeRunesInString(s, len, runes)) {
    return false;
  }
  unicode.reserve(runes.size());
  for (size_t i = 0; i < runes.size(); i++) {
    unicode.push_back(runes[i].rune);
  }
  return true;
}